

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode.c
# Opt level: O0

int arkResizeVectors(ARKodeMem ark_mem,ARKVecResizeFn resize,void *resize_data,sunindextype lrw_diff
                    ,sunindextype liw_diff,N_Vector tmpl)

{
  int iVar1;
  undefined4 in_ECX;
  ARKVecResizeFn in_RDX;
  ARKodeMem in_RSI;
  long in_RDI;
  undefined4 in_R8D;
  undefined8 in_R9;
  N_Vector *unaff_retaddr;
  int local_4;
  
  iVar1 = arkResizeVec(in_RSI,in_RDX,(void *)CONCAT44(in_ECX,in_R8D),
                       (sunindextype)((ulong)in_R9 >> 0x20),(sunindextype)in_R9,
                       (N_Vector)(in_RDI + 0x30),unaff_retaddr);
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    iVar1 = arkResizeVec(in_RSI,in_RDX,(void *)CONCAT44(in_ECX,in_R8D),
                         (sunindextype)((ulong)in_R9 >> 0x20),(sunindextype)in_R9,
                         (N_Vector)(in_RDI + 0x48),unaff_retaddr);
    if (iVar1 == 0) {
      local_4 = 0;
    }
    else {
      iVar1 = arkResizeVec(in_RSI,in_RDX,(void *)CONCAT44(in_ECX,in_R8D),
                           (sunindextype)((ulong)in_R9 >> 0x20),(sunindextype)in_R9,
                           (N_Vector)(in_RDI + 0xf0),unaff_retaddr);
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        if (*(int *)(in_RDI + 0x100) == 0) {
          iVar1 = arkResizeVec(in_RSI,in_RDX,(void *)CONCAT44(in_ECX,in_R8D),
                               (sunindextype)((ulong)in_R9 >> 0x20),(sunindextype)in_R9,
                               (N_Vector)(in_RDI + 0xf8),unaff_retaddr);
          if (iVar1 == 0) {
            return 0;
          }
        }
        else {
          *(undefined8 *)(in_RDI + 0xf8) = *(undefined8 *)(in_RDI + 0xf0);
        }
        iVar1 = arkResizeVec(in_RSI,in_RDX,(void *)CONCAT44(in_ECX,in_R8D),
                             (sunindextype)((ulong)in_R9 >> 0x20),(sunindextype)in_R9,
                             (N_Vector)(in_RDI + 0x110),unaff_retaddr);
        if (iVar1 == 0) {
          local_4 = 0;
        }
        else {
          iVar1 = arkResizeVec(in_RSI,in_RDX,(void *)CONCAT44(in_ECX,in_R8D),
                               (sunindextype)((ulong)in_R9 >> 0x20),(sunindextype)in_R9,
                               (N_Vector)(in_RDI + 0x118),unaff_retaddr);
          if (iVar1 == 0) {
            local_4 = 0;
          }
          else {
            iVar1 = arkResizeVec(in_RSI,in_RDX,(void *)CONCAT44(in_ECX,in_R8D),
                                 (sunindextype)((ulong)in_R9 >> 0x20),(sunindextype)in_R9,
                                 (N_Vector)(in_RDI + 0x120),unaff_retaddr);
            if (iVar1 == 0) {
              local_4 = 0;
            }
            else {
              iVar1 = arkResizeVec(in_RSI,in_RDX,(void *)CONCAT44(in_ECX,in_R8D),
                                   (sunindextype)((ulong)in_R9 >> 0x20),(sunindextype)in_R9,
                                   (N_Vector)(in_RDI + 0x128),unaff_retaddr);
              if (iVar1 == 0) {
                local_4 = 0;
              }
              else {
                iVar1 = arkResizeVec(in_RSI,in_RDX,(void *)CONCAT44(in_ECX,in_R8D),
                                     (sunindextype)((ulong)in_R9 >> 0x20),(sunindextype)in_R9,
                                     (N_Vector)(in_RDI + 0x130),unaff_retaddr);
                if (iVar1 == 0) {
                  local_4 = 0;
                }
                else {
                  iVar1 = arkResizeVec(in_RSI,in_RDX,(void *)CONCAT44(in_ECX,in_R8D),
                                       (sunindextype)((ulong)in_R9 >> 0x20),(sunindextype)in_R9,
                                       (N_Vector)(in_RDI + 0x138),unaff_retaddr);
                  if (iVar1 == 0) {
                    local_4 = 0;
                  }
                  else {
                    iVar1 = arkResizeVec(in_RSI,in_RDX,(void *)CONCAT44(in_ECX,in_R8D),
                                         (sunindextype)((ulong)in_R9 >> 0x20),(sunindextype)in_R9,
                                         (N_Vector)(in_RDI + 0x140),unaff_retaddr);
                    if (iVar1 == 0) {
                      local_4 = 0;
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return local_4;
}

Assistant:

booleantype arkResizeVectors(ARKodeMem ark_mem, ARKVecResizeFn resize,
                             void *resize_data, sunindextype lrw_diff,
                             sunindextype liw_diff, N_Vector tmpl)
{
  /* Vabstol */
  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, tmpl, &ark_mem->Vabstol))
    return(SUNFALSE);

  /* VRabstol */
  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, tmpl, &ark_mem->VRabstol))
    return(SUNFALSE);

  /* ewt */
  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, tmpl, &ark_mem->ewt))
    return(SUNFALSE);

  /* rwt  */
  if (ark_mem->rwt_is_ewt) {      /* update pointer to ewt */
    ark_mem->rwt = ark_mem->ewt;
  } else {                        /* resize if distinct from ewt */
    if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                      liw_diff, tmpl, &ark_mem->rwt))
      return(SUNFALSE);
  }

  /* yn */
  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, tmpl, &ark_mem->yn))
    return(SUNFALSE);

  /* fn */
  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, tmpl, &ark_mem->fn))
    return(SUNFALSE);

  /* tempv* */
  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, tmpl, &ark_mem->tempv1))
    return(SUNFALSE);

  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, tmpl, &ark_mem->tempv2))
    return(SUNFALSE);

  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, tmpl, &ark_mem->tempv3))
    return(SUNFALSE);

  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, tmpl, &ark_mem->tempv4))
    return(SUNFALSE);

  /* constraints */
  if (!arkResizeVec(ark_mem, resize, resize_data, lrw_diff,
                    liw_diff, tmpl, &ark_mem->constraints))
    return(SUNFALSE);

  return(SUNTRUE);
}